

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_argv.cpp
# Opt level: O3

char * __thiscall DArgs::CheckValue(DArgs *this,char *check)

{
  char cVar1;
  uint uVar2;
  FString *pFVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  
  uVar2 = (this->Argv).Count;
  if (1 < (ulong)uVar2) {
    pFVar3 = (this->Argv).Array;
    uVar6 = 1;
    do {
      iVar5 = strcasecmp(check,pFVar3[uVar6].Chars);
      if (iVar5 == 0) {
        if ((int)uVar6 < 1) {
          return (char *)0x0;
        }
        if ((int)(uVar2 - 1) <= (int)uVar6) {
          return (char *)0x0;
        }
        pcVar4 = pFVar3[uVar6 + 1].Chars;
        cVar1 = *pcVar4;
        if (cVar1 == '+') {
          return (char *)0x0;
        }
        if (cVar1 != '-') {
          return pcVar4;
        }
        return (char *)0x0;
      }
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  return (char *)0x0;
}

Assistant:

const char *DArgs::CheckValue(const char *check) const
{
	int i = CheckParm(check);

	if (i > 0 && i < (int)Argv.Size() - 1)
	{
		i++;
		return Argv[i][0] != '+' && Argv[i][0] != '-' ? Argv[i].GetChars() : NULL;
	}
	else
	{
		return NULL;
	}
}